

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O0

uint8_t * __thiscall
cdnsPreamble::parse_map_item(cdnsPreamble *this,uint8_t *in,uint8_t *in_max,int64_t val,int *err)

{
  char *local_98;
  int nb_e;
  char *e [6];
  int *err_local;
  int64_t val_local;
  uint8_t *in_max_local;
  uint8_t *in_local;
  cdnsPreamble *this_local;
  
  switch(val) {
  case 0:
    in_max_local = cbor_parse_int64(in,in_max,&this->cdns_version_major,0,err);
    break;
  case 1:
    in_max_local = cbor_parse_int64(in,in_max,&this->cdns_version_minor,0,err);
    break;
  case 2:
    in_max_local = cbor_parse_int64(in,in_max,&this->cdns_version_private,0,err);
    break;
  case 3:
    if (this->cdns_version_major < 1) {
      in_max_local = cdnsBlockParameterOld::parse(&this->old_block_parameters,in,in_max,err);
    }
    else {
      in_max_local = cbor_array_parse<cdnsBlockParameter>(in,in_max,&this->block_parameters,err);
    }
    break;
  case 4:
    in_max_local = cbor_text::parse(&this->old_generator_id,in,in_max,err);
    break;
  case 5:
    in_max_local = cbor_text::parse(&this->old_host_id,in,in_max,err);
    break;
  default:
    in_max_local = cbor_skip(in,in_max,err);
  }
  if (in_max_local == (uint8_t *)0x0) {
    memcpy(&stack0xffffffffffffff98,&PTR_anon_var_dwarf_625d4_00223d70,0x30);
    if ((val < 0) || (5 < val)) {
      local_98 = "unknown";
    }
    else {
      local_98 = *(char **)(&stack0xffffffffffffff98 + val * 8);
    }
    fprintf(_stderr,"Cannot parse block element %d (%s), err=%d\n",val & 0xffffffff,local_98,
            (ulong)(uint)*err);
  }
  return in_max_local;
}

Assistant:

uint8_t* cdnsPreamble::parse_map_item(uint8_t* in, uint8_t const* in_max, int64_t val, int* err)
{
    switch (val) {
    case 0: /* Version Major */
        in = cbor_parse_int64(in, in_max, &cdns_version_major, 0, err);
        break;
    case 1: /* Version Minor */
        in = cbor_parse_int64(in, in_max, &cdns_version_minor, 0, err);
        break;
    case 2: /* Version Private */
        in = cbor_parse_int64(in, in_max, &cdns_version_private, 0, err);
        break;
    case 3: /* Block Parameters */
        if (this->cdns_version_major > 0) {
            in = cbor_array_parse(in, in_max, &block_parameters, err);
        }
        else {
            in = old_block_parameters.parse(in, in_max, err);
        }
        break;
    case 4: /* generator-id  -- only present in draft version, part of
             * block parameter collection data otherwise. */
        in = old_generator_id.parse(in, in_max, err);
        break;
    case 5: /* host-id   -- only present in draft version, part of
             * block parameter collection data otherwise. */
        in = old_host_id.parse(in, in_max, err);
        break;
    default:
        in = cbor_skip(in, in_max, err);
        break;
    }

    if (in == NULL) {
        char const* e[] = { "v_major", "v_minor", "v_private", "block_param", "generator_id", "host_id" };
        int nb_e = (int)sizeof(e) / sizeof(char const*);

        fprintf(stderr, "Cannot parse block element %d (%s), err=%d\n", (int)val, (val >= 0 && val < nb_e) ? e[val] : "unknown", *err);
    }
    return in;
}